

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLEulerAngles.cpp
# Opt level: O2

EulerAngles *
AML::smoothInterpolate
          (EulerAngles *__return_storage_ptr__,EulerAngles *startAngles,EulerAngles *endAngles,
          double t)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  EulerSequence EVar11;
  undefined4 uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  EVar11 = startAngles->seq_;
  if (EVar11 != endAngles->seq_) {
    __return_storage_ptr__->phi = 0.0;
    __return_storage_ptr__->theta = 0.0;
    __return_storage_ptr__->psi = 0.0;
    __return_storage_ptr__->seq_ = XYZ;
    return __return_storage_ptr__;
  }
  if (0.0 <= t) {
    if (t <= 1.0) {
      dVar4 = t * t * t;
      dVar14 = dVar4 * t;
      dVar2 = t * dVar14;
      dVar1 = startAngles->psi;
      dVar13 = endAngles->psi - dVar1;
      dVar15 = endAngles->phi - startAngles->phi;
      dVar16 = endAngles->theta - startAngles->theta;
      dVar15 = dVar4 * dVar15 * 10.0 + dVar2 * dVar15 * 6.0 + dVar14 * dVar15 * -15.0 +
               startAngles->phi;
      dVar16 = dVar4 * dVar16 * 10.0 + dVar2 * dVar16 * 6.0 + dVar14 * dVar16 * -15.0 +
               startAngles->theta;
      auVar3._8_4_ = SUB84(dVar16,0);
      auVar3._0_8_ = dVar15;
      auVar3._12_4_ = (int)((ulong)dVar16 >> 0x20);
      __return_storage_ptr__->phi = dVar15;
      __return_storage_ptr__->theta = (double)auVar3._8_8_;
      __return_storage_ptr__->psi =
           dVar13 * 10.0 * dVar4 + dVar13 * 6.0 * dVar2 + dVar13 * -15.0 * dVar14 + dVar1;
      __return_storage_ptr__->seq_ = EVar11;
      return __return_storage_ptr__;
    }
    uVar5 = *(undefined4 *)&endAngles->phi;
    uVar6 = *(undefined4 *)((long)&endAngles->phi + 4);
    uVar7 = *(undefined4 *)&endAngles->theta;
    uVar8 = *(undefined4 *)((long)&endAngles->theta + 4);
    uVar9 = *(undefined4 *)&endAngles->psi;
    uVar10 = *(undefined4 *)((long)&endAngles->psi + 4);
    EVar11 = endAngles->seq_;
    uVar12 = *(undefined4 *)&endAngles->field_0x1c;
  }
  else {
    uVar5 = *(undefined4 *)&startAngles->phi;
    uVar6 = *(undefined4 *)((long)&startAngles->phi + 4);
    uVar7 = *(undefined4 *)&startAngles->theta;
    uVar8 = *(undefined4 *)((long)&startAngles->theta + 4);
    uVar9 = *(undefined4 *)&startAngles->psi;
    uVar10 = *(undefined4 *)((long)&startAngles->psi + 4);
    EVar11 = startAngles->seq_;
    uVar12 = *(undefined4 *)&startAngles->field_0x1c;
  }
  *(undefined4 *)&__return_storage_ptr__->psi = uVar9;
  *(undefined4 *)((long)&__return_storage_ptr__->psi + 4) = uVar10;
  __return_storage_ptr__->seq_ = EVar11;
  *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar12;
  *(undefined4 *)&__return_storage_ptr__->phi = uVar5;
  *(undefined4 *)((long)&__return_storage_ptr__->phi + 4) = uVar6;
  *(undefined4 *)&__return_storage_ptr__->theta = uVar7;
  *(undefined4 *)((long)&__return_storage_ptr__->theta + 4) = uVar8;
  return __return_storage_ptr__;
}

Assistant:

EulerAngles smoothInterpolate(const EulerAngles& startAngles, const EulerAngles& endAngles, double t)
    {
        if (startAngles.getEulerSequence() == endAngles.getEulerSequence())
        {
            if (t < 0.0)
            {
                return startAngles;
            }
            if (t > 1.0)
            {
                return endAngles;
            }

            double t2 = t * t;
            double t3 = t2 * t;
            double t4 = t3 * t;
            double t5 = t4 * t;

            double deltaPhi = endAngles.phi - startAngles.phi;
            double deltaTheta = endAngles.theta - startAngles.theta;
            double deltaPsi = endAngles.psi - startAngles.psi;

            double phiNew = 6 * deltaPhi * t5 + -15 * deltaPhi * t4 + 10 * deltaPhi * t3 + startAngles.phi;
            double thetaNew = 6 * deltaTheta * t5 + -15 * deltaTheta * t4 + 10 * deltaTheta * t3 + startAngles.theta;
            double psiNew = 6 * deltaPsi * t5 + -15 * deltaPsi * t4 + 10 * deltaPsi * t3 + startAngles.psi;

            return EulerAngles(phiNew, thetaNew, psiNew, startAngles.getEulerSequence());
        }
        return EulerAngles();
    }